

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

int __thiscall
QCommonListViewBase::verticalScrollToValue
          (QCommonListViewBase *this,int param_1,ScrollHint hint,bool above,bool below,QRect *area,
          QRect *rect)

{
  int xp2;
  int iVar1;
  QScrollBar *this_00;
  Representation RVar2;
  Representation RVar3;
  QRect QVar4;
  
  this_00 = verticalScrollBar(this);
  iVar1 = QAbstractSlider::value(&this_00->super_QAbstractSlider);
  xp2 = this->dd->space;
  QVar4 = QRect::adjusted(rect,-xp2,-xp2,xp2,xp2);
  RVar2 = QVar4.y1.m_i;
  if (hint == PositionAtTop || above) {
    iVar1 = iVar1 + RVar2.m_i;
  }
  else if (hint == PositionAtBottom || below) {
    RVar3.m_i = (QVar4.y2.m_i.m_i - (area->y2).m_i) + (area->y1).m_i;
    if (RVar2.m_i <= RVar3.m_i) {
      RVar3.m_i = RVar2.m_i;
    }
    iVar1 = RVar3.m_i + iVar1;
  }
  else if (hint == PositionAtCenter) {
    iVar1 = iVar1 + RVar2.m_i +
            (((area->y2).m_i + RVar2.m_i) - (QVar4.y2.m_i.m_i + (area->y1).m_i)) / -2;
  }
  return iVar1;
}

Assistant:

int QCommonListViewBase::verticalScrollToValue(int /*index*/, QListView::ScrollHint hint,
                                          bool above, bool below, const QRect &area, const QRect &rect) const
{
    int verticalValue = verticalScrollBar()->value();
    QRect adjusted = rect.adjusted(-spacing(), -spacing(), spacing(), spacing());
    if (hint == QListView::PositionAtTop || above)
        verticalValue += adjusted.top();
    else if (hint == QListView::PositionAtBottom || below)
        verticalValue += qMin(adjusted.top(), adjusted.bottom() - area.height() + 1);
    else if (hint == QListView::PositionAtCenter)
        verticalValue += adjusted.top() - ((area.height() - adjusted.height()) / 2);
    return verticalValue;
}